

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::LipmDcmEstimator::resetWithMeasurements
          (LipmDcmEstimator *this,Vector2 *measuredDcm,Vector2 *measuredZMP,Matrix2 *yaw,
          bool measurementIsWithBias,Vector2 *initBias,Vector2 *initBiasuncertainty)

{
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar1;
  Matrix<double,__1,__1,_0,__1,__1> local_250;
  Matrix2 local_238;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_210 [16];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_200 [16];
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1f0;
  NegativeReturnType local_1d0;
  NegativeReturnType local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
  local_1b0;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_198;
  MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> local_178 [8];
  Matrix2 initBiasCov;
  Matrix4 P;
  Matrix<double,__1,_1,_0,__1,_1> local_d0;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_90;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_78;
  undefined1 local_58 [8];
  Vector4 x;
  Vector2 *initBias_local;
  bool measurementIsWithBias_local;
  Matrix2 *yaw_local;
  Vector2 *measuredZMP_local;
  Vector2 *measuredDcm_local;
  LipmDcmEstimator *this_local;
  
  x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       (double)initBias;
  KalmanFilterBase::reset(&(this->filter_).super_KalmanFilterBase);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(&this->previousZmp_,measuredZMP);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::operator=(&this->previousOrientation_,yaw);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_58);
  if (measurementIsWithBias) {
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
              (&local_90,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)measuredDcm,
               (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::operator<<
              (&local_78,(DenseBase<Eigen::Matrix<double,4,1,0,4,1>> *)local_58,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_90);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_78,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_78);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::operator<<
              (&local_c0,(DenseBase<Eigen::Matrix<double,4,1,0,4,1>> *)local_58,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)measuredDcm);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_c0,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
               x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_c0);
  }
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_d0,
             (EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_58);
  ZeroDelayObserver::setState((ZeroDelayObserver *)&this->filter_,(StateVector *)&local_d0,0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_d0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (initBiasCov.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array + 3));
  if (measurementIsWithBias) {
    Vec2ToSqDiag_((Matrix2 *)local_178,initBiasuncertainty);
    Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator+
              (&local_1b0,local_178,(MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&this->R_);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::operator<<
              (&local_198,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (initBiasCov.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array + 3),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                *)&local_1b0);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator-
              (&local_1c0,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_178);
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_198,
                        (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)&local_1c0);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator-
              (&local_1d0,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_178);
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,
                        (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)&local_1d0);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_178);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_198);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::operator<<
              (&local_1f0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (initBiasCov.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array + 3),(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&this->R_);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_1f0,local_200);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,local_210);
    Vec2ToSqDiag_(&local_238,initBiasuncertainty);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_238);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_1f0);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,4,4,0,4,4>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_250,
             (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
             (initBiasCov.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array + 3));
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_250);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_250);
  return;
}

Assistant:

void LipmDcmEstimator::resetWithMeasurements(const Vector2 & measuredDcm,
                                             const Vector2 & measuredZMP,
                                             const Matrix2 & yaw,
                                             bool measurementIsWithBias,
                                             const Vector2 & initBias,
                                             const Vector2 & initBiasuncertainty)

{
  filter_.reset();
  previousZmp_ = measuredZMP;
  previousOrientation_ = yaw;

  Vector4 x;

  /// initialize the state using the measurement
  if(measurementIsWithBias)
  {
    x << measuredDcm - initBias, initBias;
  }
  else
  {
    x << measuredDcm, initBias;
  }

  filter_.setState(x, 0);
  Matrix4 P;

  if(measurementIsWithBias)
  {
    Matrix2 initBiasCov = Vec2ToSqDiag_(initBiasuncertainty);
    /// The state and the
    // clang-format off
    P<< initBiasCov+R_, -initBiasCov,
       -initBiasCov,     initBiasCov;
    // clang-format on
  }
  else
  {
    // clang-format off
    P<< R_,               Matrix2::Zero(),
        Matrix2::Zero(),  Vec2ToSqDiag_(initBiasuncertainty);
    // clang-format on
  }

  filter_.setStateCovariance(P);
}